

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::image_atomic
               (NegativeTestContext *ctx,TextureType imageType)

{
  MemoryQualifier memory;
  long lVar1;
  long lVar2;
  long lVar3;
  string local_98;
  TextureFormat local_78 [6];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_78[0].order = RGBA;
  local_78[0].type = SIGNED_INT32;
  local_78[1].order = RGBA;
  local_78[1].type = SIGNED_INT16;
  local_78[2].order = RGBA;
  local_78[2].type = SIGNED_INT8;
  local_78[3].order = R;
  local_78[3].type = SIGNED_INT32;
  local_78[4].order = RGBA;
  local_78[4].type = UNSIGNED_INT32;
  local_78[5].order = RGBA;
  local_78[5].type = UNSIGNED_INT16;
  local_48 = 8;
  uStack_44 = 0x1e;
  uStack_40 = 0;
  uStack_3c = 0x21;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "It is an error to pass a writeonly and/or readonly image to imageAtomic*.","");
  NegativeTestContext::beginSection(ctx,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  lVar2 = 0;
  do {
    memory = (&DAT_01c833ec)[lVar2];
    lVar1 = 0;
    do {
      lVar3 = 0;
      do {
        testShader(ctx,*(ImageOperation *)((long)&DAT_01c833d0 + lVar3),memory,imageType,
                   local_78 + lVar1);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x1c);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void image_atomic (NegativeTestContext& ctx, glu::TextureTestUtil::TextureType imageType)
{
	const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::UNSIGNED_INT32)
	};

	const MemoryQualifier memoryOptions[] =
	{
		MEMORY_READONLY,
		MEMORY_WRITEONLY,
		MEMORY_BOTH
	};

	const ImageOperation imageOperations[] =
	{
		IMAGE_OPERATION_ATOMIC_ADD,
		IMAGE_OPERATION_ATOMIC_MIN,
		IMAGE_OPERATION_ATOMIC_MAX,
		IMAGE_OPERATION_ATOMIC_AND,
		IMAGE_OPERATION_ATOMIC_OR,
		IMAGE_OPERATION_ATOMIC_XOR,
		IMAGE_OPERATION_ATOMIC_COMP_SWAP
	};

	ctx.beginSection("It is an error to pass a writeonly and/or readonly image to imageAtomic*.");
	for (int memoryNdx = 0; memoryNdx < DE_LENGTH_OF_ARRAY(memoryOptions); ++memoryNdx)
	{
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(formats); ++fmtNdx)
		{
			for (int functionNdx = 0; functionNdx < DE_LENGTH_OF_ARRAY(imageOperations); ++functionNdx)
			{
				testShader(ctx, imageOperations[functionNdx], memoryOptions[memoryNdx], imageType, formats[fmtNdx]);
			}
		}
	}
	ctx.endSection();
}